

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O1

void __thiscall rsg::Function::~Function(Function *this)

{
  Variable *this_00;
  pointer pcVar1;
  pointer ppVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppVVar4;
  
  ppVVar2 = (this->m_parameters).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar4 = (this->m_parameters).
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppVVar4 != ppVVar2; ppVVar4 = ppVVar4 + 1) {
    this_00 = *ppVVar4;
    if (this_00 != (Variable *)0x0) {
      Variable::~Variable(this_00);
      operator_delete(this_00,0x80);
    }
    ppVVar2 = (this->m_parameters).
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppVVar4 = (this->m_parameters).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != ppVVar4) {
    (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVVar4;
  }
  BlockStatement::~BlockStatement(&this->m_functionBlock);
  VariableType::~VariableType(&this->m_returnType);
  ppVVar4 = (this->m_parameters).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar4 != (pointer)0x0) {
    operator_delete(ppVVar4,(long)(this->m_parameters).
                                  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar4
                   );
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar3 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Function::~Function (void)
{
	deleteVectorElements(m_parameters);
}